

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void processOPN(UA_Server *server,UA_Connection *connection,UA_UInt32 channelId,UA_ByteString *msg)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  undefined1 local_21c [8];
  UA_SecureConversationMessageHeader respHeader;
  UA_NodeId responseType;
  size_t tmpPos;
  UA_ByteString resp_msg;
  UA_SecureChannel *channel;
  UA_OpenSecureChannelResponse p;
  size_t offset;
  UA_OpenSecureChannelRequest r;
  UA_NodeId requestType;
  UA_SequenceHeader seqHeader;
  UA_AsymmetricAlgorithmSecurityHeader asymHeader;
  UA_StatusCode retval;
  UA_ByteString *msg_local;
  UA_UInt32 channelId_local;
  UA_Connection *connection_local;
  UA_Server *server_local;
  
  asymHeader.receiverCertificateThumbprint.data._4_4_ = 0;
  if (connection->state != UA_CONNECTION_ESTABLISHED) {
    asymHeader.receiverCertificateThumbprint.data._4_4_ = -0x7ffb0000;
  }
  if ((connection->channel == (UA_SecureChannel *)0x0) && (channelId != 0)) {
    asymHeader.receiverCertificateThumbprint.data._4_4_ = -0x7ffb0000;
  }
  if ((connection->channel != (UA_SecureChannel *)0x0) &&
     (channelId != (connection->channel->securityToken).channelId)) {
    asymHeader.receiverCertificateThumbprint.data._4_4_ = -0x7ffb0000;
  }
  p.serverNonce.data = (UA_Byte *)0x0;
  UVar1 = UA_AsymmetricAlgorithmSecurityHeader_decodeBinary
                    (msg,(size_t *)&p.serverNonce.data,
                     (UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
  UVar2 = UA_SequenceHeader_decodeBinary
                    (msg,(size_t *)&p.serverNonce.data,
                     (UA_SequenceHeader *)&requestType.identifier.string.data);
  UVar3 = UA_NodeId_decodeBinary
                    (msg,(size_t *)&p.serverNonce.data,(UA_NodeId *)&r.requestedLifetime);
  UVar4 = UA_OpenSecureChannelRequest_decodeBinary
                    (msg,(size_t *)&p.serverNonce.data,(UA_OpenSecureChannelRequest *)&offset);
  if ((UVar4 == 0 &&
       (UVar3 == 0 &&
       (UVar2 == 0 && (UVar1 == 0 && asymHeader.receiverCertificateThumbprint.data._4_4_ == 0)))) &&
     (requestType._0_4_ == 0x1be)) {
    UA_OpenSecureChannelResponse_init((UA_OpenSecureChannelResponse *)&channel);
    Service_OpenSecureChannel
              (server,connection,(UA_OpenSecureChannelRequest *)&offset,
               (UA_OpenSecureChannelResponse *)&channel);
    UA_OpenSecureChannelRequest_deleteMembers((UA_OpenSecureChannelRequest *)&offset);
    resp_msg.data = (UA_Byte *)connection->channel;
    if ((UA_SecureChannel *)resp_msg.data == (UA_SecureChannel *)0x0) {
      UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)&channel);
      UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
      (*connection->close)(connection);
    }
    else {
      ((UA_SecureChannel *)resp_msg.data)->receiveSequenceNumber = requestType.identifier._8_4_;
      UA_ByteString_init((UA_ByteString *)&tmpPos);
      UVar1 = (*connection->getSendBuffer)
                        (connection,(size_t)(connection->localConf).sendBufferSize,
                         (UA_ByteString *)&tmpPos);
      if (UVar1 == 0) {
        responseType.identifier.string.data = (UA_Byte *)0xc;
        requestType.identifier._8_4_ = UA_atomic_add((uint32_t *)(resp_msg.data + 0xbc),1);
        UVar1 = UA_AsymmetricAlgorithmSecurityHeader_encodeBinary
                          ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader,
                           (UA_ByteString *)&tmpPos,(size_t *)responseType.identifier.guid.data4);
        UVar2 = UA_SequenceHeader_encodeBinary
                          ((UA_SequenceHeader *)&requestType.identifier.string.data,
                           (UA_ByteString *)&tmpPos,(size_t *)responseType.identifier.guid.data4);
        UA_NODEID_NUMERIC((UA_NodeId *)&respHeader.messageHeader.messageSize,0,0x1c1);
        UVar3 = UA_NodeId_encodeBinary
                          ((UA_NodeId *)&respHeader.messageHeader.messageSize,
                           (UA_ByteString *)&tmpPos,(size_t *)responseType.identifier.guid.data4);
        UVar4 = UA_OpenSecureChannelResponse_encodeBinary
                          ((UA_OpenSecureChannelResponse *)&channel,(UA_ByteString *)&tmpPos,
                           (size_t *)responseType.identifier.guid.data4);
        if (UVar4 == 0 && (UVar3 == 0 && (UVar2 == 0 && UVar1 == 0))) {
          local_21c._0_4_ = 0x464e504f;
          local_21c._4_4_ = SUB84(responseType.identifier.string.data,0);
          respHeader.messageHeader.messageTypeAndChunkType = p.serverProtocolVersion;
          responseType.identifier.string.data = (UA_Byte *)0x0;
          UA_SecureConversationMessageHeader_encodeBinary
                    ((UA_SecureConversationMessageHeader *)local_21c,(UA_ByteString *)&tmpPos,
                     (size_t *)responseType.identifier.guid.data4);
          tmpPos = (size_t)(uint)local_21c._4_4_;
          (*connection->send)(connection,(UA_ByteString *)&tmpPos);
          UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)&channel);
          UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                    ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
        }
        else {
          (*connection->releaseSendBuffer)(connection,(UA_ByteString *)&tmpPos);
          UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)&channel);
          UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                    ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
          (*connection->close)(connection);
        }
      }
      else {
        UA_OpenSecureChannelResponse_deleteMembers((UA_OpenSecureChannelResponse *)&channel);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
                  ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
        (*connection->close)(connection);
      }
    }
  }
  else {
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers
              ((UA_AsymmetricAlgorithmSecurityHeader *)&seqHeader);
    UA_NodeId_deleteMembers((UA_NodeId *)&r.requestedLifetime);
    UA_OpenSecureChannelRequest_deleteMembers((UA_OpenSecureChannelRequest *)&offset);
    (*connection->close)(connection);
  }
  return;
}

Assistant:

static void
processOPN(UA_Server *server, UA_Connection *connection,
           UA_UInt32 channelId, const UA_ByteString *msg) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Called before HEL */
    if(connection->state != UA_CONNECTION_ESTABLISHED)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Opening up a channel with a channelid already set */
    if(!connection->channel && channelId != 0)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;
    /* Renew a channel with the wrong channelid */
    if(connection->channel && channelId != connection->channel->securityToken.channelId)
        retval = UA_STATUSCODE_BADCOMMUNICATIONERROR;

    /* Decode the request */
    UA_AsymmetricAlgorithmSecurityHeader asymHeader;
    UA_SequenceHeader seqHeader;
    UA_NodeId requestType;
    UA_OpenSecureChannelRequest r;
    size_t offset = 0;
    retval |= UA_AsymmetricAlgorithmSecurityHeader_decodeBinary(msg, &offset, &asymHeader);
    retval |= UA_SequenceHeader_decodeBinary(msg, &offset, &seqHeader);
    retval |= UA_NodeId_decodeBinary(msg, &offset, &requestType);
    retval |= UA_OpenSecureChannelRequest_decodeBinary(msg, &offset, &r);

    /* Error occured */
    if(retval != UA_STATUSCODE_GOOD || requestType.identifier.numeric != 446) {
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        UA_NodeId_deleteMembers(&requestType);
        UA_OpenSecureChannelRequest_deleteMembers(&r);
        connection->close(connection);
        return;
    }

    /* Call the service */
    UA_OpenSecureChannelResponse p;
    UA_OpenSecureChannelResponse_init(&p);
    Service_OpenSecureChannel(server, connection, &r, &p);
    UA_OpenSecureChannelRequest_deleteMembers(&r);

    /* Opening the channel failed */
    UA_SecureChannel *channel = connection->channel;
    if(!channel) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Set the starting sequence number */
    channel->receiveSequenceNumber = seqHeader.sequenceNumber;

    /* Allocate the return message */
    UA_ByteString resp_msg;
    UA_ByteString_init(&resp_msg);
    retval = connection->getSendBuffer(connection, connection->localConf.sendBufferSize, &resp_msg);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the message after the secureconversationmessageheader */
    size_t tmpPos = 12; /* skip the header */
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    retval |= UA_AsymmetricAlgorithmSecurityHeader_encodeBinary(&asymHeader, &resp_msg, &tmpPos); // just mirror back
    retval |= UA_SequenceHeader_encodeBinary(&seqHeader, &resp_msg, &tmpPos);
    UA_NodeId responseType = UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_OPENSECURECHANNELRESPONSE].binaryEncodingId);
    retval |= UA_NodeId_encodeBinary(&responseType, &resp_msg, &tmpPos);
    retval |= UA_OpenSecureChannelResponse_encodeBinary(&p, &resp_msg, &tmpPos);

    if(retval != UA_STATUSCODE_GOOD) {
        connection->releaseSendBuffer(connection, &resp_msg);
        UA_OpenSecureChannelResponse_deleteMembers(&p);
        UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
        connection->close(connection);
        return;
    }

    /* Encode the secureconversationmessageheader (cannot fail) and send */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.messageHeader.messageTypeAndChunkType = UA_MESSAGETYPE_OPN + UA_CHUNKTYPE_FINAL;
    respHeader.messageHeader.messageSize = (UA_UInt32)tmpPos;
    respHeader.secureChannelId = p.securityToken.channelId;
    tmpPos = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, &resp_msg, &tmpPos);
    resp_msg.length = respHeader.messageHeader.messageSize;
    connection->send(connection, &resp_msg);

    /* Clean up */
    UA_OpenSecureChannelResponse_deleteMembers(&p);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&asymHeader);
}